

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O3

void __thiscall
adios2sys::Encoding::CommandLineArguments::~CommandLineArguments(CommandLineArguments *this)

{
  pointer ppcVar1;
  ulong uVar2;
  
  ppcVar1 = (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar1) {
    uVar2 = 0;
    do {
      free(ppcVar1[uVar2]);
      uVar2 = uVar2 + 1;
      ppcVar1 = (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3))
    ;
  }
  if (ppcVar1 != (pointer)0x0) {
    operator_delete(ppcVar1);
    return;
  }
  return;
}

Assistant:

Encoding::CommandLineArguments::~CommandLineArguments()
{
  for (size_t i = 0; i < this->argv_.size(); i++) {
    free(argv_[i]);
  }
}